

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexSeparableFilter::applyToCorner
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f,int eid)

{
  byte bVar1;
  uint faceid_00;
  float *__src;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  int cedgeId [10];
  int cfaceId [10];
  FaceInfo *cface [10];
  int local_170;
  int aiStack_168 [12];
  uint auStack_138 [12];
  PtexSeparableKernel local_108;
  FaceInfo *apFStack_88 [11];
  FaceInfo *f_00;
  
  bVar1 = f->flags;
  uVar7 = 0;
  f_00 = f;
  uVar6 = faceid;
  iVar5 = eid;
  do {
    faceid_00 = f_00->adjfaces[iVar5];
    bVar2 = bVar1 & 8;
    uVar4 = f_00->adjedges >> ((char)iVar5 * '\x02' & 0x1fU) & 3;
    iVar5 = uVar4 + 1;
    if (uVar4 == 3) {
      iVar5 = 0;
    }
    if (((int)faceid_00 < 0) || ((faceid_00 == faceid && (iVar5 == eid)))) {
      if ((int)uVar7 == 3) {
        applyToCornerFace(this,k,f,eid,auStack_138[1],apFStack_88[1],aiStack_168[1]);
        return;
      }
      if (3 < uVar7) {
        local_170 = (int)uVar7 + -2;
        PtexSeparableKernel::rotate(k,eid + 2);
        fVar10 = PtexSeparableKernel::weight(k);
        fVar9 = PtexSeparableKernel::makeSymmetric(k,fVar10);
        uVar8 = 1;
        do {
          local_108.res = k->res;
          __src = k->kv;
          iVar5 = k->rot;
          local_108.u = k->u;
          local_108.v = k->v;
          local_108.uw = k->uw;
          local_108.vw = k->vw;
          iVar3 = k->vw;
          memcpy(local_108.kubuff,k->ku,(long)k->uw << 2);
          memcpy(local_108.kvbuff,__src,(long)iVar3 << 2);
          local_108.ku = local_108.kubuff;
          local_108.kv = local_108.kvbuff;
          local_108.rot = iVar5;
          applyToCornerFace(this,&local_108,f,2,auStack_138[uVar8],apFStack_88[uVar8],
                            aiStack_168[uVar8]);
          uVar8 = uVar8 + 1;
        } while ((uVar7 - 1 & 0xffffffff) != uVar8);
        this->_weight = (fVar9 * (float)local_170 - fVar10) + this->_weight;
        return;
      }
      break;
    }
    iVar3 = (*this->_tx->_vptr_PtexTexture[0x10])(this->_tx,(ulong)faceid_00);
    f_00 = (FaceInfo *)CONCAT44(extraout_var,iVar3);
    auStack_138[uVar7] = faceid_00;
    aiStack_168[uVar7] = iVar5;
    apFStack_88[uVar7] = f_00;
    bVar1 = f_00->flags;
    if ((((bVar1 & 8) == 0) && (bVar2 != 0)) && (f_00->adjfaces[iVar5 - 1U & 3] == uVar6)) {
      PtexSeparableKernel::adjustSubfaceToMain(k,eid + (uint)(uVar7 == 1) * 2);
      PtexSeparableKernel::rotate(k,((eid - (uint)(uVar7 == 1)) - iVar5) + 3);
      splitAndApply(this,k,faceid_00,f_00);
      return;
    }
    uVar7 = uVar7 + 1;
    uVar6 = faceid_00;
  } while (uVar7 != 10);
  fVar10 = PtexSeparableKernel::weight(k);
  this->_weight = this->_weight - fVar10;
  return;
}

Assistant:

void PtexSeparableFilter::applyToCorner(PtexSeparableKernel& k, int faceid,
                                        const Ptex::FaceInfo& f, int eid)
{
    // traverse clockwise around corner vertex and gather corner faces
    int afid = faceid, aeid = eid;
    const FaceInfo* af = &f;
    bool prevIsSubface = af->isSubface();

    const int MaxValence = 10;
    int cfaceId[MaxValence];
    int cedgeId[MaxValence];
    const FaceInfo* cface[MaxValence];

    int numCorners = 0;
    for (int i = 0; i < MaxValence; i++) {
        // advance to next face
        int prevFace = afid;
        afid = af->adjface(aeid);
        aeid = (af->adjedge(aeid) + 1) % 4;

        // we hit a boundary or reached starting face
        // note: we need to check edge id too because we might have
        // a periodic texture (w/ toroidal topology) where all 4 corners
        // are from the same face
        if (afid < 0 || (afid == faceid && aeid == eid)) {
            numCorners = i - 2;
            break;
        }

        // record face info
        af = &_tx->getFaceInfo(afid);
        cfaceId[i] = afid;
        cedgeId[i] = aeid;
        cface[i] = af;

        // check to see if corner is a subface "tee"
        bool isSubface = af->isSubface();
        if (prevIsSubface && !isSubface && af->adjface((aeid+3)%4) == prevFace)
        {
            // adjust the eid depending on whether we started from
            // the primary or secondary subface.
            bool primary = (i==1);
            k.adjustSubfaceToMain(eid + primary * 2);
            k.rotate(eid - aeid + 3 - primary);
            splitAndApply(k, afid, *af);
            return;
        }
        prevIsSubface = isSubface;
    }

    if (numCorners == 1) {
        // regular case (valence 4)
        applyToCornerFace(k, f, eid, cfaceId[1], *cface[1], cedgeId[1]);
    }
    else if (numCorners > 1) {
        // valence 5+, make kernel symmetric and apply equally to each face
        // first, rotate to standard orientation, u=v=0
        k.rotate(eid + 2);
        float initialWeight = k.weight();
        float newWeight = k.makeSymmetric(initialWeight);
        for (int i = 1; i <= numCorners; i++) {
            PtexSeparableKernel kc = k;
            applyToCornerFace(kc, f, 2, cfaceId[i], *cface[i], cedgeId[i]);
        }
        // adjust weight for symmetrification and for additional corners
        _weight += newWeight * (float)numCorners - initialWeight;
    }
    else {
        // valence 2 or 3, ignore corner face (just adjust weight)
        _weight -= k.weight();
    }
}